

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)15>
                 (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double x)

{
  bool bVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *this;
  double extraout_XMM0_Qa;
  double l;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  double sum;
  vector<double,_std::allocator<double>_> lag;
  double x_local;
  CurrentNodes<(TasGrid::TypeOneDRule)15> *current_local;
  
  lag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)x;
  evalLagrange((vector<double,_std::allocator<double>_> *)&sum,&current->nodes,&current->coeff,x);
  __range2 = (vector<double,_std::allocator<double>_> *)0x0;
  __end2 = ::std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)&sum);
  l = (double)::std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)&sum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&l);
    if (!bVar1) break;
    this = &__end2;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator*
              (this);
    ::std::abs((int)this);
    __range2 = (vector<double,_std::allocator<double>_> *)(extraout_XMM0_Qa + (double)__range2);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end2);
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&sum);
  return (double)__range2;
}

Assistant:

double getValue<rule_maxlebesgue>(CurrentNodes<rule_maxlebesgue> const& current, double x){
    std::vector<double> lag = evalLagrange(current.nodes, current.coeff, x);
    double sum = 0.0;
    for(auto l : lag) sum += std::abs(l);
    return sum;
}